

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::api::json::DecodeLockingScript::~DecodeLockingScript(DecodeLockingScript *this)

{
  DecodeLockingScript *in_RDI;
  
  ~DecodeLockingScript(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~DecodeLockingScript() {
    // do nothing
  }